

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O2

double double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  char cVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  undefined6 in_register_0000000a;
  char **ppcVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  char **ppcVar10;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  byte bVar11;
  byte bVar12;
  Double *this;
  uint uVar13;
  DiyFp diy_fp;
  undefined7 in_stack_00000009;
  char *end_local;
  double local_48;
  
  ppcVar10 = (char **)CONCAT71(in_register_00000011,sign);
  ppcVar8 = (char **)CONCAT62(in_register_0000000a,separator);
  puVar2 = (undefined1 *)CONCAT71(in_stack_00000009,read_as_double);
  *puVar2 = 1;
  end_local = end;
  local_48 = junk_string_value;
  while (**current == '0') {
    bVar3 = Advance<char*>(current,separator,(int)&end_local,ppcVar8);
    ppcVar10 = extraout_RDX;
    if (bVar3) {
      *puVar2 = 0;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  ppcVar8 = (char **)0x18;
  if (allow_trailing_junk) {
    ppcVar8 = (char **)0x35;
  }
  this = (Double *)0x0;
  while( true ) {
    iVar4 = (int)**current;
    if ((0x37 < iVar4) || (9 < iVar4 - 0x30U)) {
      uVar13 = 0;
      if ((!parse_as_hex_float) &&
         (bVar3 = AdvanceToNonspace<char*>(current,end), ppcVar10 = extraout_RDX_01, bVar3)) {
        return local_48;
      }
      goto LAB_008536b4;
    }
    this = (Double *)((long)iVar4 + (long)this * 8 + -0x30);
    uVar6 = (long)this >> (sbyte)ppcVar8;
    if ((int)uVar6 != 0) break;
    bVar3 = Advance<char*>(current,separator,(int)&end_local,ppcVar8);
    ppcVar10 = extraout_RDX_00;
    if (bVar3) {
      uVar13 = 0;
      ppcVar10 = extraout_RDX_00;
LAB_008536b4:
      *(undefined1 *)CONCAT71(in_stack_00000009,read_as_double) = 0;
      if ((uVar13 != 0) && (this != (Double *)0x0)) {
        diy_fp.f_ = (ulong)uVar13;
        diy_fp._8_8_ = ppcVar10;
        dVar7 = (double)Double::DiyFpToUint64(this,diy_fp);
        if (sign) {
          return (double)((ulong)dVar7 ^ (ulong)DAT_00c22190);
        }
        return dVar7;
      }
      if (sign) {
        if (this == (Double *)0x0) {
          return -0.0;
        }
        this = (Double *)-(long)this;
      }
      return (double)(long)this;
    }
  }
  uVar13 = 1;
  bVar12 = 0;
  for (; 1 < (int)(uint)uVar6; uVar6 = (ulong)((uint)uVar6 >> 1)) {
    uVar13 = uVar13 + 1;
    bVar12 = bVar12 + 1;
  }
  uVar6 = (long)this >> ((byte)uVar13 & 0x3f);
  uVar9 = (uint)this & ~(-1 << ((byte)uVar13 & 0x1f));
  bVar11 = 1;
  uVar5 = uVar13;
  while (bVar3 = Advance<char*>(current,separator,(int)&end_local,(char **)(ulong)uVar5), !bVar3) {
    cVar1 = **current;
    if ((0x37 < cVar1) || (uVar5 = (int)cVar1 - 0x30, 9 < uVar5)) break;
    bVar11 = bVar11 & cVar1 == '0';
    uVar13 = uVar13 + 3;
  }
  if ((!parse_as_hex_float) && (bVar3 = AdvanceToNonspace<char*>(current,end), bVar3)) {
    return local_48;
  }
  uVar5 = 1 << (bVar12 & 0x1f);
  if ((int)uVar5 < (int)uVar9) {
    uVar6 = uVar6 + 1;
  }
  else if (uVar9 == uVar5) {
    uVar6 = uVar6 + ((byte)(~bVar11 | (byte)uVar6) & 1);
  }
  bVar3 = (uVar6 >> (long)ppcVar8 & 1) != 0;
  uVar13 = uVar13 + bVar3;
  this = (Double *)((long)uVar6 >> bVar3);
  ppcVar10 = ppcVar8;
  goto LAB_008536b4;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}